

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O1

size_t fs_user_config_dir(char *path,size_t buffer_size)

{
  size_type sVar1;
  string_view s;
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  fs_user_config_dir_abi_cxx11_();
  s._M_str = (char *)local_38;
  s._M_len = local_30;
  sVar1 = fs_str2char(s,path,buffer_size);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return sVar1;
}

Assistant:

size_t fs_user_config_dir(char* path, const size_t buffer_size)
{
  return fs_str2char(fs_user_config_dir(), path, buffer_size);
}